

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall
diff_match_patch_test::assertEquals
          (diff_match_patch_test *this,wstring *strCase,deque<Diff,_std::allocator<Diff>_> *list1,
          deque<Diff,_std::allocator<Diff>_> *list2)

{
  _Elt_pointer pDVar1;
  char cVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  reference pDVar6;
  wstring *this_00;
  long __n;
  _Elt_pointer pDVar7;
  Diff *d1;
  _Elt_pointer pDVar8;
  _Map_pointer local_c0;
  _Map_pointer local_b0;
  wstring listString2;
  Diff d2;
  allocator<wchar_t> local_50 [32];
  
  sVar4 = std::deque<Diff,_std::allocator<Diff>_>::size(list1);
  sVar5 = std::deque<Diff,_std::allocator<Diff>_>::size(list2);
  if (sVar4 == sVar5) {
    pDVar8 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    pDVar7 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_last;
    local_b0 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node;
    pDVar1 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    __n = 0;
    while( true ) {
      if (pDVar8 == pDVar1) {
        ResetOutputStream();
        wprintf(L"%ls OK",(strCase->_M_dataplus)._M_p);
        wprintf(L"\n");
        return;
      }
      pDVar6 = std::_Deque_iterator<Diff,_Diff_&,_Diff_*>::operator[]
                         (&(list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.
                           super__Deque_impl_data._M_start,__n);
      Diff::Diff(&d2,pDVar6);
      cVar2 = Diff::operator!=(pDVar8,(Diff *)&d2);
      std::__cxx11::wstring::~wstring((wstring *)&d2.text);
      if (cVar2 != '\0') break;
      __n = __n + 1;
      pDVar8 = pDVar8 + 1;
      if (pDVar8 == pDVar7) {
        pDVar8 = local_b0[1];
        local_b0 = local_b0 + 1;
        pDVar7 = pDVar8 + 0xc;
      }
    }
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&d2,L"(L",(allocator<wchar_t> *)&listString2);
  pDVar8 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  pDVar7 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  local_c0 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  pDVar1 = (list1->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  bVar3 = true;
  while (pDVar8 != pDVar1) {
    if (!bVar3) {
      std::__cxx11::wstring::append((wchar_t *)&d2);
    }
    Diff::toString_abi_cxx11_();
    std::__cxx11::wstring::append((wstring *)&d2);
    std::__cxx11::wstring::~wstring((wstring *)&listString2);
    pDVar8 = pDVar8 + 1;
    bVar3 = false;
    if (pDVar8 == pDVar7) {
      pDVar8 = local_c0[1];
      local_c0 = local_c0 + 1;
      pDVar7 = pDVar8 + 0xc;
      bVar3 = false;
    }
  }
  std::__cxx11::wstring::append((wchar_t *)&d2);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&listString2,L"(L",local_50);
  pDVar8 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_cur;
  pDVar7 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_start._M_last;
  local_c0 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_node;
  pDVar1 = (list2->super__Deque_base<Diff,_std::allocator<Diff>_>)._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  bVar3 = true;
  while (pDVar8 != pDVar1) {
    if (!bVar3) {
      std::__cxx11::wstring::append((wchar_t *)&listString2);
    }
    Diff::toString_abi_cxx11_();
    std::__cxx11::wstring::append((wstring *)&listString2);
    std::__cxx11::wstring::~wstring((wstring *)local_50);
    pDVar8 = pDVar8 + 1;
    bVar3 = false;
    if (pDVar8 == pDVar7) {
      pDVar8 = local_c0[1];
      local_c0 = local_c0 + 1;
      pDVar7 = pDVar8 + 0xc;
      bVar3 = false;
    }
  }
  std::__cxx11::wstring::append((wchar_t *)&listString2);
  ResetOutputStream();
  wprintf(L"%ls FAIL\nExpected: %ls\nActual: %ls",(strCase->_M_dataplus)._M_p,d2._0_8_,
          listString2._M_dataplus._M_p);
  wprintf(L"\n");
  this_00 = (wstring *)__cxa_allocate_exception(0x20);
  std::__cxx11::wstring::wstring(this_00,(wstring *)strCase);
  __cxa_throw(this_00,&std::__cxx11::wstring::typeinfo,std::__cxx11::wstring::~wstring);
}

Assistant:

void diff_match_patch_test::assertEquals(const std::wstring &strCase, const std::deque<Diff> &list1, const std::deque<Diff> &list2) {
  bool fail = false;
  if (list1.size() == list2.size()) {
    int i = 0;
    for (const Diff& d1 : list1) {
      Diff d2 = list2[i];
      if (d1 != d2) {
        fail = true;
        break;
      }
      i++;
    }
  } else {
    fail = true;
  }

  if (fail) {
    // Build human readable description of both lists.
    std::wstring listString1 = L"(L";
    bool first = true;
    for (const Diff& d1 : list1) {
      if (!first) {
        listString1 += L", L";
      }
      listString1 += d1.toString();
      first = false;
    }
    listString1 += L")";
    std::wstring listString2 = L"(L";
    first = true;
    for (const Diff& d2 : list2) {
      if (!first) {
        listString2 += L", L";
      }
      listString2 += d2.toString();
      first = false;
    }
    listString2 += L")";
    dmpDebug(L"%ls FAIL\nExpected: %ls\nActual: %ls",
        dmpPrintable(strCase), dmpPrintable(listString1), dmpPrintable(listString2));
    throw strCase;
  }
  dmpDebug(L"%ls OK", dmpPrintable(strCase));
}